

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::GetIntCase::iterate(GetIntCase *this)

{
  ostringstream *this_00;
  TestContext *this_01;
  GLenum err;
  GLint value;
  Enum<int,_2UL> local_1a0;
  undefined1 local_190 [384];
  
  value = 0;
  glwGetIntegerv(this->m_param,&value);
  err = glwGetError();
  glu::checkError(err,"glGetIntegerv(m_param, &value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/tes2CapabilityTests.cpp"
                  ,0x38);
  local_190._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  local_1a0.m_value = this->m_param;
  local_1a0.m_getName = glu::getParamQueryName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1a0,(ostream *)this_00);
  std::operator<<((ostream *)this_00," = ");
  std::ostream::operator<<(this_00,value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  this_01 = (this->super_TestCase).super_TestNode.m_testCtx;
  de::toString<int>((string *)local_190,&value);
  tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_190._0_8_);
  std::__cxx11::string::~string((string *)local_190);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		GLint value = 0;
		GLU_CHECK_CALL(glGetIntegerv(m_param, &value));

		m_testCtx.getLog() << TestLog::Message << glu::getParamQueryStr(m_param) << " = " << value << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(value).c_str());
		return STOP;
	}